

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colGc.c
# Opt level: O0

void Col_ResumeGC(void)

{
  uint performGc_00;
  void *pvVar1;
  ulong local_38;
  ulong local_30;
  int performGc;
  size_t threshold;
  ThreadData *data;
  
  pvVar1 = pthread_getspecific(tsdKey);
  if (*(long *)((long)pvVar1 + 0x20) == 0) {
    Col_Error(COL_ERROR,ColibriDomain,3);
  }
  else if (*(ulong *)((long)pvVar1 + 0x20) < 2) {
    local_38 = *(ulong *)(*(long *)((long)pvVar1 + 8) + 0x860) / 10;
    if (local_38 < 0x40) {
      local_30 = 0x40;
    }
    else {
      if (0x400 < local_38) {
        local_38 = 0x400;
      }
      local_30 = local_38;
    }
    performGc_00 = (uint)(local_30 <= *(ulong *)((long)pvVar1 + 0x440));
    if (**(int **)((long)pvVar1 + 8) == 0) {
      if (performGc_00 != 0) {
        PerformGC(*(GroupData **)((long)pvVar1 + 8));
      }
    }
    else {
      PlatSyncResumeGC(*(GroupData **)((long)pvVar1 + 8),performGc_00);
    }
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
  }
  else {
    *(long *)((long)pvVar1 + 0x20) = *(long *)((long)pvVar1 + 0x20) + -1;
  }
  return;
}

Assistant:

void
Col_ResumeGC()
{
    ThreadData *data = PlatGetThreadData();

    /*
     * Check preconditions.
     */

    /*! @error{COL_ERROR_GCPROTECT} */
    PRECONDITION_GCPROTECTED(data) return;

    if (data->pauseGC > 1) {
        /*
         * Within nested sections.
         */

        data->pauseGC--;
        return;
    } else {
        /*
         * Leaving protected section.
         */

        size_t threshold = data->groupData->pools[0].nbPages / GC_GEN_FACTOR;

        /*
         * GC is needed when the number of pages allocated since the last GC
         * exceed a given threshold.
         */

        int performGc = (data->eden.nbAlloc >= GC_THRESHOLD(threshold));
        ASSERT(data->pauseGC == 1);
        SyncResumeGC(data->groupData, performGc);
        data->pauseGC = 0;
    }
}